

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmon.cpp
# Opt level: O0

void __thiscall
netmon::read_raw_network_stats_test
          (netmon *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          *stats,string *read_path)

{
  bool bVar1;
  mapped_type *pmVar2;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>,_bool>
  pVar3;
  ifstream net_stream;
  string net_fname;
  unsigned_long_long value_read;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *if_param;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  parameter *param;
  const_iterator __end2;
  const_iterator __begin2;
  parameter_list *__range2;
  parameter *in_stack_fffffffffffffc08;
  monitored_value *in_stack_fffffffffffffc10;
  parameter *in_stack_fffffffffffffc18;
  monitored_value *in_stack_fffffffffffffc20;
  string *psVar4;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
  in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  key_type *in_stack_fffffffffffffc48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  *in_stack_fffffffffffffc50;
  string local_1b0 [32];
  monitored_value *local_190;
  reference local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  long local_170;
  _Base_ptr local_168;
  undefined1 local_160;
  string local_58 [32];
  reference local_38;
  parameter *local_30;
  __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
  local_28;
  long local_20;
  
  read_raw_network_stats_test::iteration = read_raw_network_stats_test::iteration + 1;
  if (read_raw_network_stats_test::iteration == 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             *)0x31d656);
    local_20 = in_RDI + 0x20;
    local_28._M_current =
         (parameter *)
         std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::begin
                   (in_stack_fffffffffffffc08);
    local_30 = (parameter *)
               std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::end
                         ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
                          in_stack_fffffffffffffc08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                               *)in_stack_fffffffffffffc08), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                 ::operator*(&local_28);
      in_stack_fffffffffffffc38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x38);
      prmon::parameter::get_name_abi_cxx11_(in_stack_fffffffffffffc08);
      prmon::parameter::parameter
                ((parameter *)in_stack_fffffffffffffc30._M_node,
                 (parameter *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
      prmon::monitored_value::monitored_value
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0),
                 (mon_value)in_stack_fffffffffffffc08);
      pVar3 = std::
              map<std::__cxx11::string,prmon::monitored_value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
              ::emplace<std::__cxx11::string_const,prmon::monitored_value>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                          *)in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_name,
                         in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc30 = pVar3.first._M_node;
      in_stack_fffffffffffffc2f = pVar3.second;
      local_168 = in_stack_fffffffffffffc30._M_node;
      local_160 = in_stack_fffffffffffffc2f;
      prmon::monitored_value::~monitored_value((monitored_value *)0x31d76b);
      prmon::parameter::~parameter(&in_stack_fffffffffffffc10->m_param);
      std::__cxx11::string::~string(local_58);
      __gnu_cxx::
      __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
      ::operator++(&local_28);
    }
  }
  local_170 = in_RDI + 0x98;
  local_178._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc08);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc08), bVar1) {
    local_188 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_178);
    local_190 = (monitored_value *)0x0;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    *pmVar2 = 0;
    psVar4 = local_1b0;
    std::operator+(in_stack_fffffffffffffc38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc30._M_node);
    std::ifstream::ifstream(&stack0xfffffffffffffc48,psVar4,_S_in);
    std::istream::operator>>((istream *)&stack0xfffffffffffffc48,(ulonglong *)&local_190);
    in_stack_fffffffffffffc10 = local_190;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    *pmVar2 = (mapped_type)(&(in_stack_fffffffffffffc10->m_param).m_name._M_dataplus + *pmVar2);
    std::ifstream::~ifstream(&stack0xfffffffffffffc48);
    std::__cxx11::string::~string(local_1b0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_178);
  }
  return;
}

Assistant:

void netmon::read_raw_network_stats_test(
    std::map<std::string, unsigned long long>& stats,
    const std::string& read_path) {
  static int iteration = 0;
  ++iteration;
  if (iteration == 1) {
    // Reset all net_stats initialised in constructor to 0 for testing
    net_stats.clear();
    for (const auto& param : params) {
      net_stats.emplace(param.get_name(),
                        prmon::monitored_value(param, true, 0));
    }
  }
  for (const auto& if_param : interface_params) {
    unsigned long long value_read{};
    stats[if_param] = 0;
    std::string net_fname = read_path + if_param;
    std::ifstream net_stream(net_fname);
    net_stream >> value_read;
    stats[if_param] += value_read;
  }
}